

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

Error __thiscall asmjit::ZoneBitVector::fill(ZoneBitVector *this,size_t from,size_t to,bool value)

{
  ulong *puVar1;
  long lVar2;
  Error EVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  
  if (from < to) {
    if (*(ulong *)(this + 8) < from) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/zone.cpp"
                 ,0x23b,"from <= _length");
    }
    if (*(ulong *)(this + 8) < to) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/zone.cpp"
                 ,0x23c,"to <= _length");
    }
    lVar2 = *(long *)this;
    if (lVar2 == 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/zone.cpp"
                 ,0x248,"data != nullptr");
    }
    uVar4 = from >> 6;
    uVar6 = (uint)from & 0x3f;
    uVar7 = to >> 6;
    uVar5 = (uint)to & 0x3f;
    if ((from & 0x3f) != 0) {
      if (uVar4 == uVar7) {
        if (uVar6 < uVar5) {
          uVar7 = ~(-1L << ((ulong)(uVar5 - uVar6) & 0x3f)) << uVar6;
          if (value) {
            puVar1 = (ulong *)(lVar2 + uVar4 * 8);
            *puVar1 = *puVar1 | uVar7;
          }
          else {
            puVar1 = (ulong *)(lVar2 + uVar4 * 8);
            *puVar1 = *puVar1 & ~uVar7;
          }
          return 0;
        }
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/zone.cpp"
                   ,0x24d,"startBit < endBit");
      }
      if (value) {
        puVar1 = (ulong *)(lVar2 + uVar4 * 8);
        *puVar1 = *puVar1 | -1L << uVar6;
      }
      else {
        puVar1 = (ulong *)(lVar2 + uVar4 * 8);
        *puVar1 = *puVar1 & ~(-1L << uVar6);
      }
      uVar4 = uVar4 + 1;
    }
    if (uVar4 <= uVar7 && uVar7 - uVar4 != 0) {
      auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar10 = vpbroadcastq_avx512f();
      uVar8 = 0;
      auVar11 = vpbroadcastq_avx512f();
      do {
        auVar12 = vpbroadcastq_avx512f();
        auVar12 = vporq_avx512f(auVar12,auVar9);
        vpcmpuq_avx512f(auVar12,auVar10,2);
        auVar12 = vmovdqu64_avx512f(auVar11);
        *(undefined1 (*) [64])(lVar2 + uVar4 * 8 + uVar8 * 8) = auVar12;
        uVar8 = uVar8 + 8;
      } while (((uVar7 - uVar4) + 7 & 0xfffffffffffffff8) != uVar8);
    }
    EVar3 = 0;
    if ((to & 0x3f) != 0) {
      EVar3 = 0;
      if (value) {
        puVar1 = (ulong *)(lVar2 + uVar7 * 8);
        *puVar1 = *puVar1 | ~(-1L << uVar5);
      }
      else {
        puVar1 = (ulong *)(lVar2 + uVar7 * 8);
        *puVar1 = *puVar1 & -1L << uVar5;
      }
    }
  }
  else {
    EVar3 = (uint)(to < from) + (uint)(to < from) * 2;
  }
  return EVar3;
}

Assistant:

Error ZoneBitVector::fill(size_t from, size_t to, bool value) noexcept {
  if (ASMJIT_UNLIKELY(from >= to)) {
    if (from > to)
      return DebugUtils::errored(kErrorInvalidArgument);
    else
      return kErrorOk;
  }

  ASMJIT_ASSERT(from <= _length);
  ASMJIT_ASSERT(to <= _length);

  // This is very similar to `ZoneBitVector::_fill()`, however, since we
  // actually set bits that are already part of the container we need to
  // special case filiing to zeros and ones.
  size_t idx = from / kBitsPerWord;
  size_t startBit = from % kBitsPerWord;

  size_t endIdx = to / kBitsPerWord;
  size_t endBit = to % kBitsPerWord;

  BitWord* data = _data;
  ASMJIT_ASSERT(data != nullptr);

  // Special case for non-zero `startBit`.
  if (startBit) {
    if (idx == endIdx) {
      ASMJIT_ASSERT(startBit < endBit);

      size_t nBits = endBit - startBit;
      BitWord mask = ((static_cast<BitWord>(1) << nBits) - 1) << startBit;

      if (value)
        data[idx] |= mask;
      else
        data[idx] &= ~mask;
      return kErrorOk;
    }
    else {
      BitWord mask = (static_cast<BitWord>(0) - 1) << startBit;

      if (value)
        data[idx++] |= mask;
      else
        data[idx++] &= ~mask;
    }
  }

  // Fill all bits in case there is a gap between the current `idx` and `endIdx`.
  if (idx < endIdx) {
    BitWord pattern = _patternFromBit(value);
    do {
      data[idx++] = pattern;
    } while (idx < endIdx);
  }

  // Special case for non-zero `endBit`.
  if (endBit) {
    BitWord mask = ((static_cast<BitWord>(1) << endBit) - 1);
    if (value)
      data[endIdx] |= mask;
    else
      data[endIdx] &= ~mask;
  }

  return kErrorOk;
}